

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O1

int mbedtls_aes_self_test(int verbose)

{
  bool bVar1;
  char cVar2;
  uint uVar3;
  uchar (*pauVar4) [32];
  uchar (*pauVar5) [16];
  char *pcVar6;
  uint uVar7;
  uchar *puVar8;
  size_t __n;
  uint uVar9;
  int iVar10;
  uchar (*pauVar11) [48];
  uint keybits;
  uchar (*pauVar12) [32];
  uint uVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  size_t offset;
  uchar buf [64];
  uchar iv [16];
  uchar prv [16];
  uchar nonce_counter [16];
  uchar stream_block [16];
  mbedtls_aes_context ctx;
  mbedtls_aes_xts_context ctx_xts;
  uchar tmp [16];
  size_t local_460;
  undefined1 local_458 [16];
  undefined8 local_448;
  undefined8 uStack_440;
  uchar local_438 [40];
  uchar (*local_410) [16];
  uchar local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  uchar local_3b8 [16];
  mbedtls_aes_context local_3a8;
  mbedtls_aes_xts_context local_288;
  
  local_408[0] = '\0';
  local_408[1] = '\0';
  local_408[2] = '\0';
  local_408[3] = '\0';
  local_408[4] = '\0';
  local_408[5] = '\0';
  local_408[6] = '\0';
  local_408[7] = '\0';
  local_408[8] = '\0';
  local_408[9] = '\0';
  local_408[10] = '\0';
  local_408[0xb] = '\0';
  local_408[0xc] = '\0';
  local_408[0xd] = '\0';
  local_408[0xe] = '\0';
  local_408[0xf] = '\0';
  local_3f8 = (undefined1  [16])0x0;
  memset(&local_3a8,0,0x120);
  uVar13 = 0;
  do {
    uVar9 = (uVar13 >> 1) * 0x40 + 0x80;
    uVar7 = uVar13 & 1;
    if (verbose != 0) {
      pcVar6 = "enc";
      if (uVar7 == 0) {
        pcVar6 = "dec";
      }
      printf("  AES-ECB-%3d (%s): ",(ulong)uVar9,pcVar6);
    }
    local_458 = (undefined1  [16])0x0;
    if (uVar7 == 0) {
      uVar3 = mbedtls_aes_setkey_dec(&local_3a8,local_408,uVar9);
      pauVar5 = aes_test_ecb_dec;
    }
    else {
      uVar3 = mbedtls_aes_setkey_enc(&local_3a8,local_408,uVar9);
      pauVar5 = aes_test_ecb_enc;
    }
    pcVar6 = "skipped";
    if (uVar9 == 0xc0 && uVar3 == 0xffffff8e) {
LAB_0010e1ac:
      puts(pcVar6);
    }
    else {
      if (uVar3 != 0) goto LAB_0010ea0c;
      local_410 = pauVar5 + (uVar13 >> 1);
      iVar10 = 10000;
      do {
        uVar3 = mbedtls_aes_crypt_ecb(&local_3a8,uVar7,local_458,local_458);
        if (uVar3 != 0) goto LAB_0010ea0c;
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
      auVar15[0] = -((*local_410)[0] == local_458[0]);
      auVar15[1] = -((*local_410)[1] == local_458[1]);
      auVar15[2] = -((*local_410)[2] == local_458[2]);
      auVar15[3] = -((*local_410)[3] == local_458[3]);
      auVar15[4] = -((*local_410)[4] == local_458[4]);
      auVar15[5] = -((*local_410)[5] == local_458[5]);
      auVar15[6] = -((*local_410)[6] == local_458[6]);
      auVar15[7] = -((*local_410)[7] == local_458[7]);
      auVar15[8] = -((*local_410)[8] == local_458[8]);
      auVar15[9] = -((*local_410)[9] == local_458[9]);
      auVar15[10] = -((*local_410)[10] == local_458[10]);
      auVar15[0xb] = -((*local_410)[0xb] == local_458[0xb]);
      auVar15[0xc] = -((*local_410)[0xc] == local_458[0xc]);
      auVar15[0xd] = -((*local_410)[0xd] == local_458[0xd]);
      auVar15[0xe] = -((*local_410)[0xe] == local_458[0xe]);
      auVar15[0xf] = -((*local_410)[0xf] == local_458[0xf]);
      if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar15[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0010ea4b;
      pcVar6 = "passed";
      if (verbose != 0) goto LAB_0010e1ac;
    }
    uVar13 = uVar13 + 1;
  } while (uVar13 != 6);
  if (verbose != 0) {
    putchar(10);
  }
  uVar13 = 0;
  do {
    uVar7 = (uVar13 >> 1) * 0x40 + 0x80;
    uVar9 = uVar13 & 1;
    if (verbose != 0) {
      pcVar6 = "enc";
      if (uVar9 == 0) {
        pcVar6 = "dec";
      }
      printf("  AES-CBC-%3d (%s): ",(ulong)uVar7,pcVar6);
    }
    local_3e8 = (undefined1  [16])0x0;
    local_3d8 = (undefined1  [16])0x0;
    local_458 = (undefined1  [16])0x0;
    if (uVar9 == 0) {
      uVar3 = mbedtls_aes_setkey_dec(&local_3a8,local_408,uVar7);
      pauVar5 = aes_test_cbc_dec;
    }
    else {
      uVar3 = mbedtls_aes_setkey_enc(&local_3a8,local_408,uVar7);
      pauVar5 = aes_test_cbc_enc;
    }
    pcVar6 = "skipped";
    if (uVar7 == 0xc0 && uVar3 == 0xffffff8e) {
LAB_0010e31a:
      puts(pcVar6);
    }
    else {
      if (uVar3 != 0) goto LAB_0010ea0c;
      local_410 = pauVar5 + (uVar13 >> 1);
      iVar10 = 10000;
      do {
        auVar15 = local_3d8;
        if (uVar9 != 0) {
          local_3d8 = local_458;
          local_458 = auVar15;
        }
        uVar3 = mbedtls_aes_crypt_cbc(&local_3a8,uVar9,0x10,local_3e8,local_458,local_458);
        if (uVar3 != 0) goto LAB_0010ea0c;
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
      auVar16[0] = -((*local_410)[0] == local_458[0]);
      auVar16[1] = -((*local_410)[1] == local_458[1]);
      auVar16[2] = -((*local_410)[2] == local_458[2]);
      auVar16[3] = -((*local_410)[3] == local_458[3]);
      auVar16[4] = -((*local_410)[4] == local_458[4]);
      auVar16[5] = -((*local_410)[5] == local_458[5]);
      auVar16[6] = -((*local_410)[6] == local_458[6]);
      auVar16[7] = -((*local_410)[7] == local_458[7]);
      auVar16[8] = -((*local_410)[8] == local_458[8]);
      auVar16[9] = -((*local_410)[9] == local_458[9]);
      auVar16[10] = -((*local_410)[10] == local_458[10]);
      auVar16[0xb] = -((*local_410)[0xb] == local_458[0xb]);
      auVar16[0xc] = -((*local_410)[0xc] == local_458[0xc]);
      auVar16[0xd] = -((*local_410)[0xd] == local_458[0xd]);
      auVar16[0xe] = -((*local_410)[0xe] == local_458[0xe]);
      auVar16[0xf] = -((*local_410)[0xf] == local_458[0xf]);
      if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar16[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0010ea4b;
      pcVar6 = "passed";
      if (verbose != 0) goto LAB_0010e31a;
    }
    uVar13 = uVar13 + 1;
  } while (uVar13 != 6);
  if (verbose != 0) {
    putchar(10);
  }
  uVar13 = 0;
  do {
    uVar7 = uVar13 >> 1;
    keybits = uVar7 * 0x40 + 0x80;
    uVar9 = uVar13 & 1;
    if (verbose != 0) {
      pcVar6 = "enc";
      if (uVar9 == 0) {
        pcVar6 = "dec";
      }
      printf("  AES-CFB128-%3d (%s): ",(ulong)keybits,pcVar6);
    }
    local_3e8[8] = '\b';
    local_3e8[9] = '\t';
    local_3e8[10] = '\n';
    local_3e8[0xb] = '\v';
    local_3e8[0xc] = '\f';
    local_3e8[0xd] = '\r';
    local_3e8[0xe] = '\x0e';
    local_3e8[0xf] = '\x0f';
    local_3e8[0] = '\0';
    local_3e8[1] = '\x01';
    local_3e8[2] = '\x02';
    local_3e8[3] = '\x03';
    local_3e8[4] = '\x04';
    local_3e8[5] = '\x05';
    local_3e8[6] = '\x06';
    local_3e8[7] = '\a';
    memcpy(local_408,aes_test_cfb128_key + uVar7,(ulong)(keybits >> 3));
    local_460 = 0;
    uVar3 = mbedtls_aes_setkey_enc(&local_3a8,local_408,keybits);
    pcVar6 = "skipped";
    if (keybits == 0xc0 && uVar3 == 0xffffff8e) {
LAB_0010e4db:
      puts(pcVar6);
    }
    else {
      if (uVar3 != 0) goto LAB_0010ea0c;
      if (uVar9 == 0) {
        local_458 = *(undefined1 (*) [16])aes_test_cfb128_ct[uVar7];
        local_448 = *(long *)(aes_test_cfb128_ct[uVar7] + 0x10);
        uStack_440 = *(long *)(aes_test_cfb128_ct[uVar7] + 0x18);
        local_438._0_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar7] + 0x20);
        local_438._8_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar7] + 0x28);
        local_438._16_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar7] + 0x30);
        local_438._24_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar7] + 0x38);
        puVar8 = aes_test_cfb128_pt;
      }
      else {
        local_438[0x10] = 0xf6;
        local_438[0x11] = 0x9f;
        local_438[0x12] = '$';
        local_438[0x13] = 'E';
        local_438[0x14] = 0xdf;
        local_438[0x15] = 'O';
        local_438[0x16] = 0x9b;
        local_438[0x17] = '\x17';
        local_438[0x18] = 0xad;
        local_438[0x19] = '+';
        local_438[0x1a] = 'A';
        local_438[0x1b] = '{';
        local_438[0x1c] = 0xe6;
        local_438[0x1d] = 'l';
        local_438[0x1e] = '7';
        local_438[0x1f] = '\x10';
        local_438[0] = '0';
        local_438[1] = 200;
        local_438[2] = '\x1c';
        local_438[3] = 'F';
        local_438[4] = 0xa3;
        local_438[5] = '\\';
        local_438[6] = 0xe4;
        local_438[7] = '\x11';
        local_438[8] = 0xe5;
        local_438[9] = 0xfb;
        local_438[10] = 0xc1;
        local_438[0xb] = '\x19';
        local_438[0xc] = '\x1a';
        local_438[0xd] = '\n';
        local_438[0xe] = 'R';
        local_438[0xf] = 0xef;
        local_448._0_1_ = 0xae;
        local_448._1_1_ = '-';
        local_448._2_1_ = 0x8a;
        local_448._3_1_ = 'W';
        local_448._4_1_ = '\x1e';
        local_448._5_1_ = '\x03';
        local_448._6_1_ = 0xac;
        local_448._7_1_ = 0x9c;
        uStack_440._0_1_ = 0x9e;
        uStack_440._1_1_ = 0xb7;
        uStack_440._2_1_ = 'o';
        uStack_440._3_1_ = 0xac;
        uStack_440._4_1_ = 'E';
        uStack_440._5_1_ = 0xaf;
        uStack_440._6_1_ = 0x8e;
        uStack_440._7_1_ = 'Q';
        local_458[8] = 0xe9;
        local_458[9] = '=';
        local_458[10] = '~';
        local_458[0xb] = '\x11';
        local_458[0xc] = 's';
        local_458[0xd] = 0x93;
        local_458[0xe] = '\x17';
        local_458[0xf] = '*';
        local_458[0] = 'k';
        local_458[1] = 0xc1;
        local_458[2] = 0xbe;
        local_458[3] = 0xe2;
        local_458[4] = '.';
        local_458[5] = '@';
        local_458[6] = 0x9f;
        local_458[7] = 0x96;
        puVar8 = aes_test_cfb128_ct[uVar7];
      }
      uVar3 = mbedtls_aes_crypt_cfb128
                        (&local_3a8,uVar9,0x40,&local_460,local_3e8,local_458,local_458);
      if (uVar3 != 0) goto LAB_0010ea0c;
      iVar10 = bcmp(local_458,puVar8,0x40);
      if (iVar10 != 0) goto LAB_0010ea4b;
      pcVar6 = "passed";
      if (verbose != 0) goto LAB_0010e4db;
    }
    uVar13 = uVar13 + 1;
  } while (uVar13 != 6);
  if (verbose != 0) {
    putchar(10);
  }
  uVar13 = 0;
  do {
    uVar7 = uVar13 >> 1;
    uVar9 = uVar7 * 0x40 + 0x80;
    if (verbose != 0) {
      pcVar6 = "enc";
      if ((uVar13 & 1) == 0) {
        pcVar6 = "dec";
      }
      printf("  AES-OFB-%3d (%s): ",(ulong)uVar9,pcVar6);
    }
    local_3e8[8] = '\b';
    local_3e8[9] = '\t';
    local_3e8[10] = '\n';
    local_3e8[0xb] = '\v';
    local_3e8[0xc] = '\f';
    local_3e8[0xd] = '\r';
    local_3e8[0xe] = '\x0e';
    local_3e8[0xf] = '\x0f';
    local_3e8[0] = '\0';
    local_3e8[1] = '\x01';
    local_3e8[2] = '\x02';
    local_3e8[3] = '\x03';
    local_3e8[4] = '\x04';
    local_3e8[5] = '\x05';
    local_3e8[6] = '\x06';
    local_3e8[7] = '\a';
    memcpy(local_408,aes_test_cfb128_key + uVar7,(ulong)(uVar9 >> 3));
    local_460 = 0;
    uVar3 = mbedtls_aes_setkey_enc(&local_3a8,local_408,uVar9);
    pcVar6 = "skipped";
    if (uVar9 == 0xc0 && uVar3 == 0xffffff8e) {
LAB_0010e689:
      puts(pcVar6);
    }
    else {
      if (uVar3 != 0) goto LAB_0010ea0c;
      if ((uVar13 & 1) == 0) {
        local_458 = *(undefined1 (*) [16])aes_test_ofb_ct[uVar7];
        local_448 = *(long *)(aes_test_ofb_ct[uVar7] + 0x10);
        uStack_440 = *(long *)(aes_test_ofb_ct[uVar7] + 0x18);
        local_438._0_8_ = *(undefined8 *)(aes_test_ofb_ct[uVar7] + 0x20);
        local_438._8_8_ = *(undefined8 *)(aes_test_ofb_ct[uVar7] + 0x28);
        local_438._16_8_ = *(undefined8 *)(aes_test_ofb_ct[uVar7] + 0x30);
        local_438._24_8_ = *(undefined8 *)(aes_test_ofb_ct[uVar7] + 0x38);
        puVar8 = aes_test_ofb_pt;
      }
      else {
        local_438[0x10] = 0xf6;
        local_438[0x11] = 0x9f;
        local_438[0x12] = '$';
        local_438[0x13] = 'E';
        local_438[0x14] = 0xdf;
        local_438[0x15] = 'O';
        local_438[0x16] = 0x9b;
        local_438[0x17] = '\x17';
        local_438[0x18] = 0xad;
        local_438[0x19] = '+';
        local_438[0x1a] = 'A';
        local_438[0x1b] = '{';
        local_438[0x1c] = 0xe6;
        local_438[0x1d] = 'l';
        local_438[0x1e] = '7';
        local_438[0x1f] = '\x10';
        local_438[0] = '0';
        local_438[1] = 200;
        local_438[2] = '\x1c';
        local_438[3] = 'F';
        local_438[4] = 0xa3;
        local_438[5] = '\\';
        local_438[6] = 0xe4;
        local_438[7] = '\x11';
        local_438[8] = 0xe5;
        local_438[9] = 0xfb;
        local_438[10] = 0xc1;
        local_438[0xb] = '\x19';
        local_438[0xc] = '\x1a';
        local_438[0xd] = '\n';
        local_438[0xe] = 'R';
        local_438[0xf] = 0xef;
        local_448._0_1_ = 0xae;
        local_448._1_1_ = '-';
        local_448._2_1_ = 0x8a;
        local_448._3_1_ = 'W';
        local_448._4_1_ = '\x1e';
        local_448._5_1_ = '\x03';
        local_448._6_1_ = 0xac;
        local_448._7_1_ = 0x9c;
        uStack_440._0_1_ = 0x9e;
        uStack_440._1_1_ = 0xb7;
        uStack_440._2_1_ = 'o';
        uStack_440._3_1_ = 0xac;
        uStack_440._4_1_ = 'E';
        uStack_440._5_1_ = 0xaf;
        uStack_440._6_1_ = 0x8e;
        uStack_440._7_1_ = 'Q';
        local_458[8] = 0xe9;
        local_458[9] = '=';
        local_458[10] = '~';
        local_458[0xb] = '\x11';
        local_458[0xc] = 's';
        local_458[0xd] = 0x93;
        local_458[0xe] = '\x17';
        local_458[0xf] = '*';
        local_458[0] = 'k';
        local_458[1] = 0xc1;
        local_458[2] = 0xbe;
        local_458[3] = 0xe2;
        local_458[4] = '.';
        local_458[5] = '@';
        local_458[6] = 0x9f;
        local_458[7] = 0x96;
        puVar8 = aes_test_ofb_ct[uVar7];
      }
      uVar3 = mbedtls_aes_crypt_ofb(&local_3a8,0x40,&local_460,local_3e8,local_458,local_458);
      if (uVar3 != 0) goto LAB_0010ea0c;
      iVar10 = bcmp(local_458,puVar8,0x40);
      if (iVar10 != 0) goto LAB_0010ea4b;
      pcVar6 = "passed";
      if (verbose != 0) goto LAB_0010e689;
    }
    uVar13 = uVar13 + 1;
  } while (uVar13 != 6);
  if (verbose != 0) {
    putchar(10);
  }
  uVar13 = 0;
  do {
    if (verbose != 0) {
      pcVar6 = "enc";
      if ((uVar13 & 1) == 0) {
        pcVar6 = "dec";
      }
      printf("  AES-CTR-128 (%s): ",pcVar6);
    }
    uVar7 = uVar13 >> 1;
    local_3c8 = *(undefined8 *)aes_test_ctr_nonce_counter[uVar7];
    uStack_3c0 = *(undefined8 *)(aes_test_ctr_nonce_counter[uVar7] + 8);
    local_408 = aes_test_ctr_key[uVar7];
    local_460 = 0;
    uVar3 = mbedtls_aes_setkey_enc(&local_3a8,local_408,0x80);
    if (uVar3 != 0) goto LAB_0010ea0c;
    pauVar11 = aes_test_ctr_pt;
    if ((uVar13 & 1) == 0) {
      pauVar11 = aes_test_ctr_ct;
    }
    __n = (size_t)aes_test_ctr_len[uVar7];
    memcpy(local_458,pauVar11 + uVar7,__n);
    uVar3 = mbedtls_aes_crypt_ctr
                      (&local_3a8,__n,&local_460,(uchar *)&local_3c8,local_3b8,local_458,local_458);
    if (uVar3 != 0) goto LAB_0010ea0c;
    pauVar11 = aes_test_ctr_ct;
    if ((uVar13 & 1) == 0) {
      pauVar11 = aes_test_ctr_pt;
    }
    iVar10 = bcmp(local_458,pauVar11 + uVar7,__n);
    if (iVar10 != 0) goto LAB_0010ea4b;
    if (verbose != 0) {
      puts("passed");
    }
    uVar13 = uVar13 + 1;
  } while (uVar13 != 6);
  if (verbose != 0) {
    putchar(10);
  }
  memset(&local_288,0,0x240);
  uVar13 = 0;
  do {
    uVar7 = uVar13 & 1;
    if (verbose != 0) {
      pcVar6 = "enc";
      if (uVar7 == 0) {
        pcVar6 = "dec";
      }
      printf("  AES-XTS-128 (%s): ",pcVar6);
    }
    uVar9 = uVar13 >> 1;
    local_408 = *(uchar (*) [16])aes_test_xts_key[uVar9];
    local_3f8 = *(undefined1 (*) [16])(aes_test_xts_key[uVar9] + 0x10);
    if (uVar7 == 0) {
      uVar3 = mbedtls_aes_xts_setkey_dec(&local_288,local_408,0x100);
      pauVar4 = aes_test_xts_ct32;
      pauVar12 = aes_test_xts_pt32;
    }
    else {
      uVar3 = mbedtls_aes_xts_setkey_enc(&local_288,local_408,0x100);
      pauVar4 = aes_test_xts_pt32;
      pauVar12 = aes_test_xts_ct32;
    }
    if (uVar3 == 0) {
      local_458 = *(undefined1 (*) [16])pauVar4[uVar9];
      local_448 = *(long *)(pauVar4[uVar9] + 0x10);
      uStack_440 = *(long *)(pauVar4[uVar9] + 0x10 + 8);
      uVar3 = mbedtls_aes_crypt_xts
                        (&local_288,uVar7,0x20,aes_test_xts_data_unit[uVar9],local_458,local_458);
      if (uVar3 == 0) {
        pauVar4 = pauVar12 + uVar9;
        puVar8 = pauVar12[uVar9] + 0x10;
        auVar18[0] = -(*puVar8 == (uchar)local_448);
        auVar18[1] = -(puVar8[1] == local_448._1_1_);
        auVar18[2] = -(puVar8[2] == local_448._2_1_);
        auVar18[3] = -(puVar8[3] == local_448._3_1_);
        auVar18[4] = -(puVar8[4] == local_448._4_1_);
        auVar18[5] = -(puVar8[5] == local_448._5_1_);
        auVar18[6] = -(puVar8[6] == local_448._6_1_);
        auVar18[7] = -(puVar8[7] == local_448._7_1_);
        auVar18[8] = -(puVar8[8] == (uchar)uStack_440);
        auVar18[9] = -(puVar8[9] == uStack_440._1_1_);
        auVar18[10] = -(puVar8[10] == uStack_440._2_1_);
        auVar18[0xb] = -(puVar8[0xb] == uStack_440._3_1_);
        auVar18[0xc] = -(puVar8[0xc] == uStack_440._4_1_);
        auVar18[0xd] = -(puVar8[0xd] == uStack_440._5_1_);
        auVar18[0xe] = -(puVar8[0xe] == uStack_440._6_1_);
        auVar18[0xf] = -(puVar8[0xf] == uStack_440._7_1_);
        auVar17[0] = -((*pauVar4)[0] == local_458[0]);
        auVar17[1] = -((*pauVar4)[1] == local_458[1]);
        auVar17[2] = -((*pauVar4)[2] == local_458[2]);
        auVar17[3] = -((*pauVar4)[3] == local_458[3]);
        auVar17[4] = -((*pauVar4)[4] == local_458[4]);
        auVar17[5] = -((*pauVar4)[5] == local_458[5]);
        auVar17[6] = -((*pauVar4)[6] == local_458[6]);
        auVar17[7] = -((*pauVar4)[7] == local_458[7]);
        auVar17[8] = -((*pauVar4)[8] == local_458[8]);
        auVar17[9] = -((*pauVar4)[9] == local_458[9]);
        auVar17[10] = -((*pauVar4)[10] == local_458[10]);
        auVar17[0xb] = -((*pauVar4)[0xb] == local_458[0xb]);
        auVar17[0xc] = -((*pauVar4)[0xc] == local_458[0xc]);
        auVar17[0xd] = -((*pauVar4)[0xd] == local_458[0xd]);
        auVar17[0xe] = -((*pauVar4)[0xe] == local_458[0xe]);
        auVar17[0xf] = -((*pauVar4)[0xf] == local_458[0xf]);
        auVar17 = auVar17 & auVar18;
        bVar14 = (ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) == 0xffff;
        bVar1 = !bVar14;
        uVar3 = (uint)bVar1;
        cVar2 = bVar1 * '\x05';
        if (verbose != 0) {
          uVar3 = (uint)bVar1;
          if ((uStack_440 == *(long *)(pauVar12[uVar9] + 0x18) &&
              local_458._8_8_ == *(long *)(pauVar12[uVar9] + 8)) &&
              (local_448 == *(long *)(pauVar12[uVar9] + 0x10) &&
              local_458._0_8_ == *(long *)pauVar12[uVar9])) {
            puts("passed");
            bVar14 = true;
            uVar3 = 0;
            cVar2 = '\0';
          }
        }
      }
      else {
        cVar2 = '\x05';
        bVar14 = false;
      }
    }
    else {
      cVar2 = '\x05';
      bVar14 = false;
    }
    if (!bVar14) goto LAB_0010e9fb;
    uVar13 = uVar13 + 1;
  } while (uVar13 != 6);
  if (verbose != 0) {
    putchar(10);
  }
  mbedtls_aes_xts_free(&local_288);
  cVar2 = '\0';
LAB_0010e9fb:
  if (cVar2 != '\x05') {
    if (cVar2 != '\0') {
      return uVar3;
    }
    uVar3 = 0;
  }
LAB_0010ea0c:
  if ((verbose != 0) && (uVar3 != 0)) {
    puts("failed");
  }
  mbedtls_platform_zeroize(&local_3a8,0x120);
  return uVar3;
LAB_0010ea4b:
  uVar3 = 1;
  goto LAB_0010ea0c;
}

Assistant:

int mbedtls_aes_self_test( int verbose )
{
    int ret = 0, i, j, u, mode;
    unsigned int keybits;
    unsigned char key[32];
    unsigned char buf[64];
    const unsigned char *aes_tests;
#if defined(MBEDTLS_CIPHER_MODE_CBC) || defined(MBEDTLS_CIPHER_MODE_CFB)
    unsigned char iv[16];
#endif
#if defined(MBEDTLS_CIPHER_MODE_CBC)
    unsigned char prv[16];
#endif
#if defined(MBEDTLS_CIPHER_MODE_CTR) || defined(MBEDTLS_CIPHER_MODE_CFB) || \
    defined(MBEDTLS_CIPHER_MODE_OFB)
    size_t offset;
#endif
#if defined(MBEDTLS_CIPHER_MODE_CTR) || defined(MBEDTLS_CIPHER_MODE_XTS)
    int len;
#endif
#if defined(MBEDTLS_CIPHER_MODE_CTR)
    unsigned char nonce_counter[16];
    unsigned char stream_block[16];
#endif
    mbedtls_aes_context ctx;

    memset( key, 0, 32 );
    mbedtls_aes_init( &ctx );

    /*
     * ECB mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        keybits = 128 + u * 64;
        mode = i & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-ECB-%3d (%s): ", keybits,
                            ( mode == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memset( buf, 0, 16 );

        if( mode == MBEDTLS_AES_DECRYPT )
        {
            ret = mbedtls_aes_setkey_dec( &ctx, key, keybits );
            aes_tests = aes_test_ecb_dec[u];
        }
        else
        {
            ret = mbedtls_aes_setkey_enc( &ctx, key, keybits );
            aes_tests = aes_test_ecb_enc[u];
        }

        /*
         * AES-192 is an optional feature that may be unavailable when
         * there is an alternative underlying implementation i.e. when
         * MBEDTLS_AES_ALT is defined.
         */
        if( ret == MBEDTLS_ERR_PLATFORM_FEATURE_UNSUPPORTED && keybits == 192 )
        {
            mbedtls_printf( "skipped\n" );
            continue;
        }
        else if( ret != 0 )
        {
            goto exit;
        }

        for( j = 0; j < 10000; j++ )
        {
            ret = mbedtls_aes_crypt_ecb( &ctx, mode, buf, buf );
            if( ret != 0 )
                goto exit;
        }

        if( memcmp( buf, aes_tests, 16 ) != 0 )
        {
            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

#if defined(MBEDTLS_CIPHER_MODE_CBC)
    /*
     * CBC mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        keybits = 128 + u * 64;
        mode = i & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-CBC-%3d (%s): ", keybits,
                            ( mode == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memset( iv , 0, 16 );
        memset( prv, 0, 16 );
        memset( buf, 0, 16 );

        if( mode == MBEDTLS_AES_DECRYPT )
        {
            ret = mbedtls_aes_setkey_dec( &ctx, key, keybits );
            aes_tests = aes_test_cbc_dec[u];
        }
        else
        {
            ret = mbedtls_aes_setkey_enc( &ctx, key, keybits );
            aes_tests = aes_test_cbc_enc[u];
        }

        /*
         * AES-192 is an optional feature that may be unavailable when
         * there is an alternative underlying implementation i.e. when
         * MBEDTLS_AES_ALT is defined.
         */
        if( ret == MBEDTLS_ERR_PLATFORM_FEATURE_UNSUPPORTED && keybits == 192 )
        {
            mbedtls_printf( "skipped\n" );
            continue;
        }
        else if( ret != 0 )
        {
            goto exit;
        }

        for( j = 0; j < 10000; j++ )
        {
            if( mode == MBEDTLS_AES_ENCRYPT )
            {
                unsigned char tmp[16];

                memcpy( tmp, prv, 16 );
                memcpy( prv, buf, 16 );
                memcpy( buf, tmp, 16 );
            }

            ret = mbedtls_aes_crypt_cbc( &ctx, mode, 16, iv, buf, buf );
            if( ret != 0 )
                goto exit;

        }

        if( memcmp( buf, aes_tests, 16 ) != 0 )
        {
            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_CBC */

#if defined(MBEDTLS_CIPHER_MODE_CFB)
    /*
     * CFB128 mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        keybits = 128 + u * 64;
        mode = i & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-CFB128-%3d (%s): ", keybits,
                            ( mode == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memcpy( iv,  aes_test_cfb128_iv, 16 );
        memcpy( key, aes_test_cfb128_key[u], keybits / 8 );

        offset = 0;
        ret = mbedtls_aes_setkey_enc( &ctx, key, keybits );
        /*
         * AES-192 is an optional feature that may be unavailable when
         * there is an alternative underlying implementation i.e. when
         * MBEDTLS_AES_ALT is defined.
         */
        if( ret == MBEDTLS_ERR_PLATFORM_FEATURE_UNSUPPORTED && keybits == 192 )
        {
            mbedtls_printf( "skipped\n" );
            continue;
        }
        else if( ret != 0 )
        {
            goto exit;
        }

        if( mode == MBEDTLS_AES_DECRYPT )
        {
            memcpy( buf, aes_test_cfb128_ct[u], 64 );
            aes_tests = aes_test_cfb128_pt;
        }
        else
        {
            memcpy( buf, aes_test_cfb128_pt, 64 );
            aes_tests = aes_test_cfb128_ct[u];
        }

        ret = mbedtls_aes_crypt_cfb128( &ctx, mode, 64, &offset, iv, buf, buf );
        if( ret != 0 )
            goto exit;

        if( memcmp( buf, aes_tests, 64 ) != 0 )
        {
            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_CFB */

#if defined(MBEDTLS_CIPHER_MODE_OFB)
    /*
     * OFB mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        keybits = 128 + u * 64;
        mode = i & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-OFB-%3d (%s): ", keybits,
                            ( mode == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memcpy( iv,  aes_test_ofb_iv, 16 );
        memcpy( key, aes_test_ofb_key[u], keybits / 8 );

        offset = 0;
        ret = mbedtls_aes_setkey_enc( &ctx, key, keybits );
        /*
         * AES-192 is an optional feature that may be unavailable when
         * there is an alternative underlying implementation i.e. when
         * MBEDTLS_AES_ALT is defined.
         */
        if( ret == MBEDTLS_ERR_PLATFORM_FEATURE_UNSUPPORTED && keybits == 192 )
        {
            mbedtls_printf( "skipped\n" );
            continue;
        }
        else if( ret != 0 )
        {
            goto exit;
        }

        if( mode == MBEDTLS_AES_DECRYPT )
        {
            memcpy( buf, aes_test_ofb_ct[u], 64 );
            aes_tests = aes_test_ofb_pt;
        }
        else
        {
            memcpy( buf, aes_test_ofb_pt, 64 );
            aes_tests = aes_test_ofb_ct[u];
        }

        ret = mbedtls_aes_crypt_ofb( &ctx, 64, &offset, iv, buf, buf );
        if( ret != 0 )
            goto exit;

        if( memcmp( buf, aes_tests, 64 ) != 0 )
        {
            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_OFB */

#if defined(MBEDTLS_CIPHER_MODE_CTR)
    /*
     * CTR mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        mode = i & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-CTR-128 (%s): ",
                            ( mode == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memcpy( nonce_counter, aes_test_ctr_nonce_counter[u], 16 );
        memcpy( key, aes_test_ctr_key[u], 16 );

        offset = 0;
        if( ( ret = mbedtls_aes_setkey_enc( &ctx, key, 128 ) ) != 0 )
            goto exit;

        len = aes_test_ctr_len[u];

        if( mode == MBEDTLS_AES_DECRYPT )
        {
            memcpy( buf, aes_test_ctr_ct[u], len );
            aes_tests = aes_test_ctr_pt[u];
        }
        else
        {
            memcpy( buf, aes_test_ctr_pt[u], len );
            aes_tests = aes_test_ctr_ct[u];
        }

        ret = mbedtls_aes_crypt_ctr( &ctx, len, &offset, nonce_counter,
                                     stream_block, buf, buf );
        if( ret != 0 )
            goto exit;

        if( memcmp( buf, aes_tests, len ) != 0 )
        {
            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_CTR */

#if defined(MBEDTLS_CIPHER_MODE_XTS)
    {
    static const int num_tests =
        sizeof(aes_test_xts_key) / sizeof(*aes_test_xts_key);
    mbedtls_aes_xts_context ctx_xts;

    /*
     * XTS mode
     */
    mbedtls_aes_xts_init( &ctx_xts );

    for( i = 0; i < num_tests << 1; i++ )
    {
        const unsigned char *data_unit;
        u = i >> 1;
        mode = i & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-XTS-128 (%s): ",
                            ( mode == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memset( key, 0, sizeof( key ) );
        memcpy( key, aes_test_xts_key[u], 32 );
        data_unit = aes_test_xts_data_unit[u];

        len = sizeof( *aes_test_xts_ct32 );

        if( mode == MBEDTLS_AES_DECRYPT )
        {
            ret = mbedtls_aes_xts_setkey_dec( &ctx_xts, key, 256 );
            if( ret != 0)
                goto exit;
            memcpy( buf, aes_test_xts_ct32[u], len );
            aes_tests = aes_test_xts_pt32[u];
        }
        else
        {
            ret = mbedtls_aes_xts_setkey_enc( &ctx_xts, key, 256 );
            if( ret != 0)
                goto exit;
            memcpy( buf, aes_test_xts_pt32[u], len );
            aes_tests = aes_test_xts_ct32[u];
        }


        ret = mbedtls_aes_crypt_xts( &ctx_xts, mode, len, data_unit,
                                     buf, buf );
        if( ret != 0 )
            goto exit;

        if( memcmp( buf, aes_tests, len ) != 0 )
        {
            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    mbedtls_aes_xts_free( &ctx_xts );
    }
#endif /* MBEDTLS_CIPHER_MODE_XTS */

    ret = 0;

exit:
    if( ret != 0 && verbose != 0 )
        mbedtls_printf( "failed\n" );

    mbedtls_aes_free( &ctx );

    return( ret );
}